

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,int r,int c)

{
  allocator<std::vector<float,_std::allocator<float>_>_> local_45 [16];
  allocator<float> local_35;
  value_type_conflict1 local_34;
  vector<float,_std::allocator<float>_> local_30;
  int local_18;
  int local_14;
  int c_local;
  int r_local;
  Matrix *this_local;
  
  local_34 = 0.0;
  local_18 = c;
  local_14 = r;
  _c_local = this;
  std::allocator<float>::allocator(&local_35);
  std::vector<float,_std::allocator<float>_>::vector(&local_30,(long)c,&local_34,&local_35);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator(local_45);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&this->m,(long)r,&local_30,local_45);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator(local_45);
  std::vector<float,_std::allocator<float>_>::~vector(&local_30);
  std::allocator<float>::~allocator(&local_35);
  this->rows = local_14;
  this->cols = local_18;
  return;
}

Assistant:

Matrix::Matrix(int r, int c) : m(std::vector<std::vector<float> >(r, std::vector<float>(c, 0.f))), rows(r), cols(c) {}